

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.c
# Opt level: O3

long mk_date(long index,date_t *d)

{
  char *__dest;
  uint uVar1;
  int month;
  int day;
  int iVar2;
  undefined2 uVar3;
  tm *ptVar4;
  size_t sVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  int *piVar9;
  time_t numDateTime;
  long local_30;
  
  local_30 = index * 0x15180 + 0x2960079d;
  ptVar4 = localtime(&local_30);
  lVar7 = (long)ptVar4->tm_wday + (((long)ptVar4->tm_wday + 1) / 7) * -7;
  d->daynuminweek = (int)lVar7 + 2;
  iVar8 = ptVar4->tm_mon;
  d->monthnuminyear = iVar8 + 1;
  strncpy(d->dayofweek,weekday_names[lVar7 + 1],10);
  __dest = d->month;
  strncpy(__dest,month_names[iVar8],10);
  iVar6 = ptVar4->tm_year + 0x76c;
  d->year = iVar6;
  d->daynuminmonth = ptVar4->tm_mday;
  d->yearmonthnum = iVar6 * 100 + iVar8 + 1;
  sprintf(d->yearmonth,"%.3s%d",__dest);
  sprintf(d->date,"%s %d, %d",__dest,(ulong)(uint)d->daynuminmonth,(ulong)(uint)d->year);
  uVar1 = d->year;
  iVar6 = d->daynuminweek;
  month = d->monthnuminyear;
  day = d->daynuminmonth;
  d->datekey = (long)(int)(month * 100 + uVar1 * 10000 + day);
  iVar2 = ptVar4->tm_yday;
  iVar8 = iVar2 + 1;
  d->daynuminyear = iVar8;
  iVar8 = iVar2 + (int)((ulong)((long)iVar8 * -0x6db6db6d) >> 0x20) + 1;
  d->weeknuminyear = ((iVar8 >> 2) - (iVar8 >> 0x1f)) + 1;
  d->lastdayinweekfl[0] = (iVar6 == 7) + '0';
  d->lastdayinweekfl[1] = '\0';
  piVar9 = days_in_a_month_l;
  if ((uVar1 * -0x3d70a3d7 + 0x51eb850 >> 2 | uVar1 * 0x40000000) < 0x28f5c29) {
    piVar9 = days_in_a_month;
  }
  if ((uVar1 & 3) != 0) {
    piVar9 = days_in_a_month;
  }
  d->lastdayinmonthfl[0] = piVar9[(long)month + -1] == day | 0x30;
  d->lastdayinmonthfl[1] = '\0';
  d->weekdayfl[0] = (iVar6 == 1 || iVar6 == 7) ^ 0x31;
  d->weekdayfl[1] = '\0';
  gen_season(d->sellingseason,month,day);
  sVar5 = strlen(d->sellingseason);
  d->slen = (int)sVar5;
  lVar7 = 0xc;
  while ((*(int *)(lVar7 + 0x10b37c) != d->monthnuminyear ||
         (*(int *)((long)&holidays[0].name + lVar7) != d->daynuminmonth))) {
    lVar7 = lVar7 + 0x10;
    if (lVar7 == 0xac) {
      uVar3 = 0x30;
LAB_001041b0:
      *(undefined2 *)d->holidayfl = uVar3;
      return 0;
    }
  }
  uVar3 = 0x31;
  goto LAB_001041b0;
}

Assistant:

long
mk_date(long index,date_t *d)
{
    long espan = (index-1)*60*60*24;
    
    time_t numDateTime = D_STARTDATE + espan; 

    struct tm *localTime = localtime(&numDateTime); 
 
    /*make Sunday be the first day of a week */
    d->daynuminweek=((long)localTime->tm_wday+1)%7+1;
    d->monthnuminyear=(long)localTime->tm_mon+1;
#if __GNUC__ >= 8
#pragma GCC diagnostic push
#pragma GCC diagnostic ignored "-Wstringop-truncation"
#endif
    strncpy(d->dayofweek, weekday_names[d->daynuminweek-1],D_DAYWEEK_LEN+1);
    strncpy(d->month,month_names[d->monthnuminyear-1],D_MONTH_LEN+1);
#if __GNUC__ >= 8
#pragma GCC diagnostic pop
#endif
    d->year=(long)localTime->tm_year + 1900;
    d->daynuminmonth=(long)localTime->tm_mday;
    d->yearmonthnum=d->year * 100 + d->monthnuminyear;

    sprintf(d->yearmonth,"%.3s%d",d->month,d->year);
    sprintf(d->date,"%s %d, %d",d->month,d->daynuminmonth,d->year);
    
    d->datekey = d->year*10000+d->monthnuminyear*100+ d->daynuminmonth; 

    d->daynuminyear=(int)localTime->tm_yday+1;
    d->weeknuminyear = d->daynuminyear/7 + 1;
    
    if(d->daynuminweek ==7){
	d->lastdayinweekfl[0]='1';
    }
    else{
	d->lastdayinweekfl[0]='0';
    }
    d->lastdayinweekfl[1]='\0';

    if(is_last_day_in_month(d->year,d->monthnuminyear,d->daynuminmonth)==1){
	d->lastdayinmonthfl[0]= '1';
    }else{
	d->lastdayinmonthfl[0]= '0';
    }
    d->lastdayinmonthfl[1]='\0';
 
    if(d->daynuminweek!=1 && d->daynuminweek!=7){
	d->weekdayfl[0]='1';
    }
    else{
	d->weekdayfl[0]='0';
    }
    
    d->weekdayfl[1]='\0';

    gen_season(d->sellingseason,d->monthnuminyear,d->daynuminmonth);
    d->slen = strlen(d->sellingseason);
    gen_holiday_fl(d->holidayfl,d->monthnuminyear,d->daynuminmonth);    
    return (0);
}